

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O3

void __thiscall obs::safe_list<obs::slot<void_()>_>::node::lock(node *this,iterator *it)

{
  int iVar1;
  pthread_t pVar2;
  pthread_t pVar3;
  
  iVar1 = this->locks;
  this->locks = iVar1 + 1;
  if (-1 < iVar1) {
    pVar2 = (this->creator_thread)._M_thread;
    pVar3 = pthread_self();
    if (pVar2 == pVar3) {
      it->m_next_iterator = this->creator_thread_iterator;
      this->creator_thread_iterator = it;
    }
    return;
  }
  __assert_fail("locks > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0x196,
                "void obs::safe_list<obs::slot<void ()>>::node::lock(iterator *) [T = obs::slot<void ()>]"
               );
}

Assistant:

void safe_list<T>::node::lock(iterator* it) {
  ++locks;
  assert(locks > 0);

  // If we are in the creator thread, we add this iterator in the
  // "creator thread iterators" linked-list so the iterator is
  // notified in case that the node is erased.
  if (in_creator_thread()) {
    it->m_next_iterator = creator_thread_iterator;
    creator_thread_iterator = it;
  }
}